

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O3

void __thiscall DomProperty::clear(DomProperty *this)

{
  DomFont *this_00;
  DomResourceIcon *this_01;
  DomResourcePixmap *this_02;
  DomPalette *this_03;
  DomLocale *this_04;
  DomSizePolicy *this_05;
  DomString *this_06;
  DomStringList *this_07;
  DomUrl *this_08;
  DomBrush *this_09;
  
  operator_delete(this->m_color,0x18);
  this_00 = this->m_font;
  if (this_00 != (DomFont *)0x0) {
    DomFont::~DomFont(this_00);
  }
  operator_delete(this_00,0x80);
  this_01 = this->m_iconSet;
  if (this_01 != (DomResourceIcon *)0x0) {
    DomResourceIcon::~DomResourceIcon(this_01);
  }
  operator_delete(this_01,0x98);
  this_02 = this->m_pixmap;
  if (this_02 != (DomResourcePixmap *)0x0) {
    DomResourcePixmap::~DomResourcePixmap(this_02);
  }
  operator_delete(this_02,0x58);
  this_03 = this->m_palette;
  if (this_03 != (DomPalette *)0x0) {
    DomPalette::~DomPalette(this_03);
  }
  operator_delete(this_03,0x20);
  operator_delete(this->m_point,0xc);
  operator_delete(this->m_rect,0x14);
  this_04 = this->m_locale;
  if (this_04 != (DomLocale *)0x0) {
    DomLocale::~DomLocale(this_04);
  }
  operator_delete(this_04,0x40);
  this_05 = this->m_sizePolicy;
  if (this_05 != (DomSizePolicy *)0x0) {
    DomSizePolicy::~DomSizePolicy(this_05);
  }
  operator_delete(this_05,0x50);
  operator_delete(this->m_size,0xc);
  this_06 = this->m_string;
  if (this_06 != (DomString *)0x0) {
    DomString::~DomString(this_06);
  }
  operator_delete(this_06,0x98);
  this_07 = this->m_stringList;
  if (this_07 != (DomStringList *)0x0) {
    DomStringList::~DomStringList(this_07);
  }
  operator_delete(this_07,0x98);
  operator_delete(this->m_date,0x10);
  operator_delete(this->m_time,0x10);
  operator_delete(this->m_dateTime,0x1c);
  operator_delete(this->m_pointF,0x18);
  operator_delete(this->m_rectF,0x28);
  operator_delete(this->m_sizeF,0x18);
  operator_delete(this->m_char,8);
  this_08 = this->m_url;
  if (this_08 != (DomUrl *)0x0) {
    DomUrl::~DomUrl(this_08);
  }
  operator_delete(this_08,0x10);
  this_09 = this->m_brush;
  if (this_09 != (DomBrush *)0x0) {
    DomBrush::~DomBrush(this_09);
  }
  operator_delete(this_09,0x38);
  this->m_kind = Unknown;
  this->m_color = (DomColor *)0x0;
  this->m_cursor = 0;
  this->m_point = (DomPoint *)0x0;
  this->m_rect = (DomRect *)0x0;
  this->m_pixmap = (DomResourcePixmap *)0x0;
  this->m_palette = (DomPalette *)0x0;
  this->m_font = (DomFont *)0x0;
  this->m_iconSet = (DomResourceIcon *)0x0;
  memset(&this->m_locale,0,0x84);
  this->m_uLongLong = 0;
  this->m_brush = (DomBrush *)0x0;
  return;
}

Assistant:

void DomProperty::clear()
{
    delete m_color;
    delete m_font;
    delete m_iconSet;
    delete m_pixmap;
    delete m_palette;
    delete m_point;
    delete m_rect;
    delete m_locale;
    delete m_sizePolicy;
    delete m_size;
    delete m_string;
    delete m_stringList;
    delete m_date;
    delete m_time;
    delete m_dateTime;
    delete m_pointF;
    delete m_rectF;
    delete m_sizeF;
    delete m_char;
    delete m_url;
    delete m_brush;

    m_kind = Unknown;

    m_color = nullptr;
    m_cursor = 0;
    m_font = nullptr;
    m_iconSet = nullptr;
    m_pixmap = nullptr;
    m_palette = nullptr;
    m_point = nullptr;
    m_rect = nullptr;
    m_locale = nullptr;
    m_sizePolicy = nullptr;
    m_size = nullptr;
    m_string = nullptr;
    m_stringList = nullptr;
    m_number = 0;
    m_float = 0.0;
    m_double = 0.0;
    m_date = nullptr;
    m_time = nullptr;
    m_dateTime = nullptr;
    m_pointF = nullptr;
    m_rectF = nullptr;
    m_sizeF = nullptr;
    m_longLong = 0;
    m_char = nullptr;
    m_url = nullptr;
    m_UInt = 0;
    m_uLongLong = 0;
    m_brush = nullptr;
}